

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O3

void Assimp::FBX::anon_unknown_20::ReadBinaryDataArray
               (char type,uint32_t count,char **data,char *end,
               vector<char,_std::allocator<char>_> *buff,Element *param_6)

{
  uint uVar1;
  int *piVar2;
  char *__src;
  int iVar3;
  int iVar4;
  uint uVar5;
  string local_b8;
  char *local_98;
  uint local_90;
  pointer local_80;
  int local_78;
  undefined8 uStack_58;
  undefined4 uStack_50;
  undefined4 local_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  
  piVar2 = (int *)*data;
  iVar4 = *piVar2;
  *data = (char *)(piVar2 + 1);
  uVar1 = piVar2[1];
  *data = (char *)(piVar2 + 2);
  iVar3 = 0;
  if ((byte)(type + 0x9cU) < 9) {
    iVar3 = (&DAT_001f5720)[(byte)(type + 0x9cU)];
  }
  std::vector<char,_std::allocator<char>_>::resize(buff,(ulong)(iVar3 * count));
  if (iVar4 == 1) {
    uStack_48 = 0;
    uStack_44 = 0;
    uStack_58 = 0;
    uStack_50 = 0;
    local_4c = 0;
    iVar4 = inflateInit_(&local_98,"1.2.11",0x70);
    if (iVar4 != 0) {
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,"failure initializing zlib","");
      anon_unknown.dwarf_224f1b::ParseError(&local_b8,(Element *)0x0);
    }
    local_98 = *data;
    local_80 = (buff->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
    local_78 = *(int *)&(buff->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (int)local_80;
    local_90 = uVar1;
    uVar5 = inflate(&local_98,4);
    if (1 < uVar5) {
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,"failure decompressing compressed data section","");
      anon_unknown.dwarf_224f1b::ParseError(&local_b8,(Element *)0x0);
    }
    inflateEnd(&local_98);
  }
  else if ((iVar4 == 0) && (__src = *data, __src != end)) {
    memmove((buff->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
            _M_start,__src,(long)end - (long)__src);
  }
  *data = *data + uVar1;
  return;
}

Assistant:

void ReadBinaryDataArray(char type, uint32_t count, const char*& data, const char* end,
    std::vector<char>& buff,
    const Element& /*el*/)
{
    BE_NCONST uint32_t encmode = SafeParse<uint32_t>(data, end);
    AI_SWAP4(encmode);
    data += 4;

    // next comes the compressed length
    BE_NCONST uint32_t comp_len = SafeParse<uint32_t>(data, end);
    AI_SWAP4(comp_len);
    data += 4;

    ai_assert(data + comp_len == end);

    // determine the length of the uncompressed data by looking at the type signature
    uint32_t stride = 0;
    switch(type)
    {
        case 'f':
        case 'i':
            stride = 4;
            break;

        case 'd':
        case 'l':
            stride = 8;
            break;

        default:
            ai_assert(false);
    };

    const uint32_t full_length = stride * count;
    buff.resize(full_length);

    if(encmode == 0) {
        ai_assert(full_length == comp_len);

        // plain data, no compression
        std::copy(data, end, buff.begin());
    }
    else if(encmode == 1) {
        // zlib/deflate, next comes ZIP head (0x78 0x01)
        // see http://www.ietf.org/rfc/rfc1950.txt

        z_stream zstream;
        zstream.opaque = Z_NULL;
        zstream.zalloc = Z_NULL;
        zstream.zfree  = Z_NULL;
        zstream.data_type = Z_BINARY;

        // http://hewgill.com/journal/entries/349-how-to-decompress-gzip-stream-with-zlib
        if(Z_OK != inflateInit(&zstream)) {
            ParseError("failure initializing zlib");
        }

        zstream.next_in   = reinterpret_cast<Bytef*>( const_cast<char*>(data) );
        zstream.avail_in  = comp_len;

        zstream.avail_out = static_cast<uInt>(buff.size());
        zstream.next_out = reinterpret_cast<Bytef*>(&*buff.begin());
        const int ret = inflate(&zstream, Z_FINISH);

        if (ret != Z_STREAM_END && ret != Z_OK) {
            ParseError("failure decompressing compressed data section");
        }

        // terminate zlib
        inflateEnd(&zstream);
    }
#ifdef ASSIMP_BUILD_DEBUG
    else {
        // runtime check for this happens at tokenization stage
        ai_assert(false);
    }
#endif

    data += comp_len;
    ai_assert(data == end);
}